

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bezier_arc.cpp
# Opt level: O2

int __thiscall agg::bezier_arc_svg::init(bezier_arc_svg *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  uint uVar7;
  char in_DL;
  uint i;
  uint uVar8;
  undefined4 in_XMM0_Da;
  undefined4 uVar9;
  undefined4 in_XMM0_Db;
  undefined4 uVar10;
  double in_XMM1_Qa;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM3_Qa;
  double dVar14;
  undefined1 auVar15 [16];
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double in_XMM6_Qa;
  double dVar19;
  double dVar20;
  double dVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar24;
  double local_138;
  double local_128;
  undefined8 local_f8;
  trans_affine local_80;
  trans_affine local_50;
  
  cVar6 = (char)ctx;
  local_f8 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  this[0xe0] = (bezier_arc_svg)0x1;
  local_128 = -(double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  dVar14 = ((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) - in_XMM5_Qa) * 0.5;
  dVar11 = (in_XMM1_Qa - in_XMM6_Qa) * 0.5;
  dVar2 = cos(in_XMM4_Qa);
  dVar3 = sin(in_XMM4_Qa);
  if (local_128 <= local_f8) {
    local_128 = local_f8;
  }
  dVar19 = (double)(~-(ulong)(in_XMM3_Qa < 0.0) & (ulong)in_XMM3_Qa |
                   (ulong)-local_128 & -(ulong)(in_XMM3_Qa < 0.0));
  dVar13 = dVar19 * dVar19;
  dVar12 = local_128 * local_128;
  dVar20 = dVar14 * dVar2 + dVar3 * dVar11;
  dVar23 = dVar14 * -dVar3 + dVar2 * dVar11;
  dVar14 = dVar20 * dVar20;
  dVar11 = dVar23 * dVar23;
  auVar22._8_8_ = dVar14;
  auVar22._0_8_ = dVar11;
  auVar17._8_4_ = SUB84(dVar12,0);
  auVar17._0_8_ = dVar13;
  auVar17._12_4_ = (int)((ulong)dVar12 >> 0x20);
  auVar17 = divpd(auVar22,auVar17);
  dVar16 = auVar17._0_8_ + auVar17._8_8_;
  if (1.0 < dVar16) {
    dVar19 = dVar19 * SQRT(dVar16);
    local_128 = local_128 * SQRT(dVar16);
    dVar13 = dVar19 * dVar19;
    dVar12 = local_128 * local_128;
    if (10.0 < dVar16) {
      this[0xe0] = (bezier_arc_svg)0x0;
    }
  }
  auVar18._0_8_ = -dVar13;
  auVar18._8_8_ = -dVar12;
  auVar4._8_4_ = SUB84(dVar12,0);
  auVar4._0_8_ = dVar13;
  auVar4._12_4_ = (int)((ulong)dVar12 >> 0x20);
  auVar17 = blendpd(auVar18,auVar4,2);
  dVar11 = (auVar17._0_8_ * dVar14 + (dVar12 * dVar13 - dVar11 * dVar12)) /
           (auVar17._8_8_ * dVar11 + dVar14 * dVar13);
  dVar14 = 0.0;
  if (0.0 <= dVar11) {
    dVar14 = dVar11;
  }
  dVar14 = SQRT(dVar14);
  if (cVar6 == in_DL) {
    dVar14 = -dVar14;
  }
  dVar16 = ((dVar23 * local_128) / dVar19) * dVar14;
  dVar14 = ((-dVar19 * dVar20) / local_128) * dVar14;
  auVar15._0_8_ = dVar23 - dVar14;
  auVar15._8_8_ = -dVar23 - dVar14;
  auVar5._8_4_ = SUB84(dVar19,0);
  auVar5._0_8_ = dVar19;
  auVar5._12_4_ = (int)((ulong)dVar19 >> 0x20);
  auVar17 = divpd(auVar15,auVar5);
  auVar21._0_8_ = dVar20 - dVar16;
  auVar21._8_8_ = -dVar20 - dVar16;
  auVar1._8_4_ = SUB84(local_128,0);
  auVar1._0_8_ = local_128;
  auVar1._12_4_ = (int)((ulong)local_128 >> 0x20);
  auVar22 = divpd(auVar21,auVar1);
  dVar19 = auVar17._0_8_;
  dVar20 = auVar17._8_8_;
  dVar23 = auVar22._0_8_;
  dVar24 = auVar22._8_8_;
  dVar11 = dVar23 * dVar23 + dVar19 * dVar19;
  dVar12 = dVar23 / SQRT(dVar11);
  dVar13 = -1.0;
  if (-1.0 <= dVar12) {
    dVar13 = dVar12;
  }
  dVar12 = 1.0;
  if (dVar13 <= 1.0) {
    dVar12 = dVar13;
  }
  acos(dVar12);
  dVar11 = (dVar24 * dVar24 + dVar20 * dVar20) * dVar11;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar11 = (dVar23 * dVar24 + dVar19 * dVar20) / dVar11;
  dVar13 = -1.0;
  if (-1.0 <= dVar11) {
    dVar13 = dVar11;
  }
  uVar9 = 0;
  uVar10 = 0x3ff00000;
  if (dVar13 <= 1.0) {
    uVar9 = SUB84(dVar13,0);
    uVar10 = (undefined4)((ulong)dVar13 >> 0x20);
  }
  acos((double)CONCAT44(uVar10,uVar9));
  bezier_arc::init((bezier_arc *)this,ctx);
  dVar11 = cos(in_XMM4_Qa);
  dVar13 = sin(in_XMM4_Qa);
  local_138 = sin(in_XMM4_Qa);
  local_138 = -local_138;
  local_50.sy = cos(in_XMM4_Qa);
  local_50.tx = 0.0;
  local_50.ty = 0.0;
  local_50.shx = local_138;
  local_80.sx = 1.0;
  local_80.shy = 0.0;
  local_80.shx = 0.0;
  local_80.sy = 1.0;
  local_80.tx = (in_XMM5_Qa + (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) * 0.5 +
                dVar2 * dVar16 + -dVar3 * dVar14;
  local_80.ty = (in_XMM6_Qa + in_XMM1_Qa) * 0.5 + dVar3 * dVar16 + dVar2 * dVar14;
  local_50.sx = dVar11;
  local_50.shy = dVar13;
  trans_affine::multiply(&local_50,&local_80);
  uVar8 = 2;
  while( true ) {
    uVar7 = *(uint *)(this + 4);
    if (uVar7 - 2 <= uVar8) break;
    trans_affine::transform
              (&local_50,(double *)(this + (ulong)uVar8 * 8 + 8),
               (double *)(this + (ulong)uVar8 * 8 + 0x10));
    uVar8 = uVar8 + 2;
  }
  *(ulong *)(this + 8) = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  *(double *)(this + 0x10) = in_XMM1_Qa;
  if (2 < uVar7) {
    *(double *)(this + (ulong)(uVar7 - 2) * 8 + 8) = in_XMM5_Qa;
    uVar7 = uVar7 - 1;
    *(double *)(this + (ulong)uVar7 * 8 + 8) = in_XMM6_Qa;
  }
  return uVar7;
}

Assistant:

void bezier_arc_svg::init(double x0, double y0, 
                              double rx, double ry, 
                              double angle,
                              bool large_arc_flag,
                              bool sweep_flag,
                              double x2, double y2)
    {
        m_radii_ok = true;

        if(rx < 0.0) rx = -rx;
        if(ry < 0.0) ry = -rx;

        // Calculate the middle point between 
        // the current and the final points
        //------------------------
        double dx2 = (x0 - x2) / 2.0;
        double dy2 = (y0 - y2) / 2.0;

        double cos_a = cos(angle);
        double sin_a = sin(angle);

        // Calculate (x1, y1)
        //------------------------
        double x1 =  cos_a * dx2 + sin_a * dy2;
        double y1 = -sin_a * dx2 + cos_a * dy2;

        // Ensure radii are large enough
        //------------------------
        double prx = rx * rx;
        double pry = ry * ry;
        double px1 = x1 * x1;
        double py1 = y1 * y1;

        // Check that radii are large enough
        //------------------------
        double radii_check = px1/prx + py1/pry;
        if(radii_check > 1.0) 
        {
            rx = sqrt(radii_check) * rx;
            ry = sqrt(radii_check) * ry;
            prx = rx * rx;
            pry = ry * ry;
            if(radii_check > 10.0) m_radii_ok = false;
        }

        // Calculate (cx1, cy1)
        //------------------------
        double sign = (large_arc_flag == sweep_flag) ? -1.0 : 1.0;
        double sq   = (prx*pry - prx*py1 - pry*px1) / (prx*py1 + pry*px1);
        double coef = sign * sqrt((sq < 0) ? 0 : sq);
        double cx1  = coef *  ((rx * y1) / ry);
        double cy1  = coef * -((ry * x1) / rx);

        //
        // Calculate (cx, cy) from (cx1, cy1)
        //------------------------
        double sx2 = (x0 + x2) / 2.0;
        double sy2 = (y0 + y2) / 2.0;
        double cx = sx2 + (cos_a * cx1 - sin_a * cy1);
        double cy = sy2 + (sin_a * cx1 + cos_a * cy1);

        // Calculate the start_angle (angle1) and the sweep_angle (dangle)
        //------------------------
        double ux =  (x1 - cx1) / rx;
        double uy =  (y1 - cy1) / ry;
        double vx = (-x1 - cx1) / rx;
        double vy = (-y1 - cy1) / ry;
        double p, n;

        // Calculate the angle start
        //------------------------
        n = sqrt(ux*ux + uy*uy);
        p = ux; // (1 * ux) + (0 * uy)
        sign = (uy < 0) ? -1.0 : 1.0;
        double v = p / n;
        if(v < -1.0) v = -1.0;
        if(v >  1.0) v =  1.0;
        double start_angle = sign * acos(v);

        // Calculate the sweep angle
        //------------------------
        n = sqrt((ux*ux + uy*uy) * (vx*vx + vy*vy));
        p = ux * vx + uy * vy;
        sign = (ux * vy - uy * vx < 0) ? -1.0 : 1.0;
        v = p / n;
        if(v < -1.0) v = -1.0;
        if(v >  1.0) v =  1.0;
        double sweep_angle = sign * acos(v);
        if(!sweep_flag && sweep_angle > 0) 
        {
            sweep_angle -= pi * 2.0;
        } 
        else 
        if (sweep_flag && sweep_angle < 0) 
        {
            sweep_angle += pi * 2.0;
        }

        // We can now build and transform the resulting arc
        //------------------------
        m_arc.init(0.0, 0.0, rx, ry, start_angle, sweep_angle);
        trans_affine mtx = trans_affine_rotation(angle);
        mtx *= trans_affine_translation(cx, cy);
        
        for(unsigned i = 2; i < m_arc.num_vertices()-2; i += 2)
        {
            mtx.transform(m_arc.vertices() + i, m_arc.vertices() + i + 1);
        }

        // We must make sure that the starting and ending points
        // exactly coincide with the initial (x0,y0) and (x2,y2)
        m_arc.vertices()[0] = x0;
        m_arc.vertices()[1] = y0;
        if(m_arc.num_vertices() > 2)
        {
            m_arc.vertices()[m_arc.num_vertices() - 2] = x2;
            m_arc.vertices()[m_arc.num_vertices() - 1] = y2;
        }
    }